

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O1

int ply_close(p_ply ply)

{
  void *__ptr;
  size_t sVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  if ((ply != (p_ply)0x0) && ((FILE *)ply->fp != (FILE *)0x0)) {
    if (ply->element == (p_ply_element)0x0) {
      if (ply->nelements != 0) {
        __assert_fail("ply->element || ply->nelements == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                      ,0x2b9,"int ply_close(p_ply)");
      }
    }
    else if (ply->nelements < 1) {
      __assert_fail("!ply->element || ply->nelements > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                    ,0x2ba,"int ply_close(p_ply)");
    }
    if ((ply->io_mode == PLY_WRITE) &&
       (sVar1 = fwrite(ply->buffer,1,ply->buffer_last,(FILE *)ply->fp), sVar1 < ply->buffer_last)) {
      iVar2 = 0;
      ply_ferror(ply,"Error closing up");
    }
    else {
      if (ply->own_fp != 0) {
        fclose((FILE *)ply->fp);
      }
      if (ply->element != (p_ply_element)0x0) {
        if (0 < ply->nelements) {
          lVar3 = 0x108;
          lVar4 = 0;
          do {
            __ptr = *(void **)(ply->element->name + lVar3);
            if (__ptr != (void *)0x0) {
              free(__ptr);
            }
            lVar4 = lVar4 + 1;
            lVar3 = lVar3 + 0x118;
          } while (lVar4 < ply->nelements);
        }
        free(ply->element);
      }
      if (ply->obj_info != (char *)0x0) {
        free(ply->obj_info);
      }
      if (ply->comment != (char *)0x0) {
        free(ply->comment);
      }
      free(ply);
      iVar2 = 1;
    }
    return iVar2;
  }
  __assert_fail("ply && ply->fp",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                ,0x2b8,"int ply_close(p_ply)");
}

Assistant:

int ply_close(p_ply ply) {
    long i;
    assert(ply && ply->fp);
    assert(ply->element || ply->nelements == 0);
    assert(!ply->element || ply->nelements > 0);
    /* write last chunk to file */
    if (ply->io_mode == PLY_WRITE &&
      fwrite(ply->buffer, 1, ply->buffer_last, ply->fp) < ply->buffer_last) {
        ply_ferror(ply, "Error closing up");
        return 0;
    }
    if (ply->own_fp) fclose(ply->fp);
    /* free all memory used by handle */
    if (ply->element) {
        for (i = 0; i < ply->nelements; i++) {
            p_ply_element element = &ply->element[i];
            if (element->property) free(element->property);
        }
        free(ply->element);
    }
    if (ply->obj_info) free(ply->obj_info);
    if (ply->comment) free(ply->comment);
    free(ply);
    return 1;
}